

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::eliminateHole
          (Earcut<unsigned_int> *this,Node *hole,Node *outerNode)

{
  Node *pNVar1;
  Node *start;
  
  pNVar1 = findHoleBridge(this,hole,outerNode);
  if (pNVar1 != (Node *)0x0) {
    start = splitPolygon(this,pNVar1,hole);
    filterPoints(this,start,start->next);
    pNVar1 = filterPoints(this,pNVar1,pNVar1->next);
    return pNVar1;
  }
  return outerNode;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::eliminateHole(Node* hole, Node* outerNode) {
    Node* bridge = findHoleBridge(hole, outerNode);
    if (!bridge) {
        return outerNode;
    }

    Node* bridgeReverse = splitPolygon(bridge, hole);

    // filter collinear points around the cuts
    filterPoints(bridgeReverse, bridgeReverse->next);

    // Check if input node was removed by the filtering
    return filterPoints(bridge, bridge->next);
}